

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScheduledReporter.cc
# Opt level: O0

void __thiscall
cppmetrics::ScheduledReporter::ScheduledReporter
          (ScheduledReporter *this,
          unique_ptr<cppmetrics::Reporter,_std::default_delete<cppmetrics::Reporter>_> *reporter,
          duration *duration)

{
  duration *duration_local;
  unique_ptr<cppmetrics::Reporter,_std::default_delete<cppmetrics::Reporter>_> *reporter_local;
  ScheduledReporter *this_local;
  
  Reporter::Reporter(&this->super_Reporter);
  (this->super_Reporter)._vptr_Reporter = (_func_int **)&PTR__ScheduledReporter_00190b28;
  std::unique_ptr<cppmetrics::Reporter,_std::default_delete<cppmetrics::Reporter>_>::unique_ptr
            (&this->m_reporter,reporter);
  (this->m_interval).__r = duration->__r;
  memset(&this->m_mutex,0,0x28);
  std::mutex::mutex(&this->m_mutex);
  std::condition_variable::condition_variable(&this->m_cv);
  this->m_is_running = false;
  std::thread::thread(&this->m_reporter_thread);
  return;
}

Assistant:

ScheduledReporter::ScheduledReporter(std::unique_ptr<Reporter>&& reporter, const std::chrono::system_clock::duration& duration)
    : m_reporter(std::move(reporter))
    , m_interval(duration)
    , m_mutex()
    , m_cv()
    , m_is_running(false)
{
}